

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O0

int BN_add(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  int cmp_res;
  int r_neg;
  int ret;
  int local_20;
  int local_1c;
  
  if (a->neg == b->neg) {
    local_20 = a->neg;
    local_1c = BN_uadd(r,a,b);
  }
  else {
    iVar1 = BN_ucmp(a,b);
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        local_20 = b->neg;
        local_1c = BN_usub(r,b,a);
      }
      else {
        local_20 = 0;
        BN_zero_ex((BIGNUM *)r);
        local_1c = 1;
      }
    }
    else {
      local_20 = a->neg;
      local_1c = BN_usub(r,a,b);
    }
  }
  r->neg = local_20;
  return local_1c;
}

Assistant:

int BN_add(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int ret, r_neg, cmp_res;

    bn_check_top(a);
    bn_check_top(b);

    if (a->neg == b->neg) {
        r_neg = a->neg;
        ret = BN_uadd(r, a, b);
    } else {
        cmp_res = BN_ucmp(a, b);
        if (cmp_res > 0) {
            r_neg = a->neg;
            ret = BN_usub(r, a, b);
        } else if (cmp_res < 0) {
            r_neg = b->neg;
            ret = BN_usub(r, b, a);
        } else {
            r_neg = 0;
            BN_zero(r);
            ret = 1;
        }
    }

    r->neg = r_neg;
    bn_check_top(r);
    return ret;
}